

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::set_anchor(OSDText *this,int line_id,float x,float y)

{
  float fVar1;
  bool bVar2;
  pointer pOVar3;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_30;
  __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
  local_28;
  iterator it;
  float y_local;
  float x_local;
  int line_id_local;
  OSDText *this_local;
  
  it._M_current._4_4_ = y;
  local_28._M_current =
       (OSDLine *)
       std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::begin(&this->lines);
  while( true ) {
    local_30._M_current =
         (OSDLine *)
         std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::end(&this->lines);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) {
      return;
    }
    pOVar3 = __gnu_cxx::
             __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
             ::operator->(&local_28);
    if (pOVar3->id == line_id) break;
    __gnu_cxx::
    __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
    ::operator++(&local_28);
  }
  pOVar3 = __gnu_cxx::
           __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
           ::operator->(&local_28);
  fVar1 = it._M_current._4_4_;
  pOVar3->x = x;
  pOVar3 = __gnu_cxx::
           __normal_iterator<CMU462::OSDLine_*,_std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>_>
           ::operator->(&local_28);
  pOVar3->y = fVar1;
  return;
}

Assistant:

void OSDText::set_anchor(int line_id, float x, float y) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      it->x = x;
      it->y = y;
      break;
    }
    ++it;
  }
}